

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  const_reference ppTVar4;
  ostream *poVar5;
  int width;
  ulong local_100;
  size_t i_1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  ulong local_80;
  size_t i;
  undefined1 local_70 [4];
  int total_tests;
  string kIndent;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string kTestsuites;
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases_local;
  ostream *stream_local;
  
  kTestsuites.field_2._8_8_ = test_cases;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"testsuites",&local_39);
  std::allocator<char>::~allocator(&local_39);
  Indent_abi_cxx11_((string *)local_70,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  i._4_4_ = 0;
  local_80 = 0;
  while( true ) {
    uVar1 = local_80;
    sVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                      ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                       kTestsuites.field_2._8_8_);
    if (sVar3 <= uVar1) break;
    ppTVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                         kTestsuites.field_2._8_8_,local_80);
    iVar2 = TestCase::total_test_count(*ppTVar4);
    i._4_4_ = iVar2 + i._4_4_;
    local_80 = local_80 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"tests",&local_a1);
  OutputJsonKey(stream,(string *)local_38,&local_a0,i._4_4_,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"name",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"AllTests",(allocator<char> *)((long)&i_1 + 7));
  OutputJsonKey(stream,(string *)local_38,&local_c8,&local_f0,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  poVar5 = std::operator<<(stream,(string *)local_70);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)local_38);
  std::operator<<(poVar5,"\": [\n");
  local_100 = 0;
  while( true ) {
    sVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                      ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                       kTestsuites.field_2._8_8_);
    if (sVar3 <= local_100) break;
    if (local_100 != 0) {
      std::operator<<(stream,",\n");
    }
    ppTVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                         kTestsuites.field_2._8_8_,local_100);
    PrintJsonTestCase(stream,*ppTVar4);
    local_100 = local_100 + 1;
  }
  poVar5 = std::operator<<(stream,"\n");
  poVar5 = std::operator<<(poVar5,(string *)local_70);
  poVar5 = std::operator<<(poVar5,"]\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestCase*>& test_cases) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (size_t i = 0; i < test_cases.size(); ++i) {
    total_tests += test_cases[i]->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_cases.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestCase(stream, *test_cases[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}